

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O0

void __thiscall Bipartition::Bipartition(Bipartition *this)

{
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  allocator<unsigned_long> *in_stack_ffffffffffffff98;
  allocator<unsigned_long> *alloc;
  undefined1 *value;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffb8;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc0;
  undefined1 local_9 [9];
  
  (in_RDI->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR_toString_abi_cxx11__001b39b8;
  alloc = (allocator<unsigned_long> *)
          &(in_RDI->m_bits).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  value = local_9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15bca5);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_RDI,in_stack_ffffffffffffff98);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15bcc0);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x15bcce);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (in_stack_ffffffffffffffc0,(size_type)in_stack_ffffffffffffffb8,(unsigned_long)value,
             alloc);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::~dynamic_bitset(in_RDI);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x15bd0e);
  return;
}

Assistant:

Bipartition::Bipartition() {
    partition = boost::dynamic_bitset<>(0);
}